

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

string * __thiscall
notch::core::PiecewiseLinearActivation::tag_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseLinearActivation *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string tag() const { return name; }